

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

ON_wString __thiscall
ON_FileSystemPath::RemoveVolumeName(ON_FileSystemPath *this,wchar_t *path,ON_wString *volume_name)

{
  wchar_t *path_00;
  int local_8c;
  ON_wString local_68;
  long local_60;
  size_t length;
  wchar_t *fext;
  wchar_t *fname;
  wchar_t *dir;
  wchar_t *vol;
  ON_wString local_28;
  ON_wString local_path;
  ON_wString *volume_name_local;
  wchar_t *path_local;
  
  local_path.m_s = (wchar_t *)volume_name;
  CleanPath((wchar_t *)&local_28);
  path_00 = ON_wString::operator_cast_to_wchar_t_(&local_28);
  dir = (wchar_t *)0x0;
  fname = (wchar_t *)0x0;
  fext = (wchar_t *)0x0;
  length = 0;
  on_wsplitpath(path_00,&dir,&fname,&fext,(wchar_t **)&length);
  if (fname == (wchar_t *)0x0) {
    if (fext == (wchar_t *)0x0) {
      if (length != 0) {
        fname = (wchar_t *)length;
      }
    }
    else {
      fname = fext;
    }
  }
  if (local_path.m_s != (wchar_t *)0x0) {
    if (((dir == (wchar_t *)0x0) || (fname == (wchar_t *)0x0)) || (fname <= dir)) {
      local_8c = 0;
    }
    else {
      local_8c = (int)((long)fname - (long)dir >> 2);
    }
    local_60 = (long)local_8c;
    if (local_60 == 0) {
      ON_wString::operator=((ON_wString *)local_path.m_s,&ON_wString::EmptyString);
    }
    else {
      ON_wString::ON_wString(&local_68,dir,local_8c);
      ON_wString::operator=((ON_wString *)local_path.m_s,&local_68);
      ON_wString::~ON_wString(&local_68);
    }
  }
  ON_wString::ON_wString((ON_wString *)this,fname);
  ON_wString::~ON_wString(&local_28);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::RemoveVolumeName(
  const wchar_t* path,
  ON_wString* volume_name
)
{
  const ON_wString local_path = ON_FileSystemPath::CleanPath(path);
  path = static_cast<const wchar_t*>(local_path);
  const wchar_t* vol = nullptr;
  const wchar_t* dir = nullptr;
  const wchar_t* fname = nullptr;
  const wchar_t* fext = nullptr;
  on_wsplitpath(path, &vol, &dir, &fname, &fext);
  if (nullptr == dir)
  {
    if (nullptr != fname)
      dir = fname;
    else if (nullptr != fext)
      dir = fext;
  }

  if (nullptr != volume_name)
  {
    size_t length
      = (nullptr != vol && nullptr != dir && vol < dir)
      ? (int)(dir - vol)
      : 0;
    if (length > 0)
      *volume_name = ON_wString(vol, (int)length);
    else
      *volume_name = ON_wString::EmptyString;
  }
  return ON_wString(dir);
}